

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryBasicGeometryShaderTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)16>_> * __thiscall
vkt::geometry::anon_unknown_0::VaryingOutputCountTestInstance::createPipelineLayout
          (Move<vk::Handle<(vk::HandleType)16>_> *__return_storage_ptr__,
          VaryingOutputCountTestInstance *this,DeviceInterface *vk,VkDevice device)

{
  void **this_00;
  VkDescriptorPool descriptorPool;
  Context *context;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  RefData<vk::Handle<(vk::HandleType)19>_> data_01;
  RefData<vk::Handle<(vk::HandleType)21>_> data_02;
  RefData<vk::Handle<(vk::HandleType)22>_> data_03;
  RefData<vk::Handle<(vk::HandleType)9>_> data_04;
  RefData<vk::Handle<(vk::HandleType)19>_> data_05;
  RefData<vk::Handle<(vk::HandleType)21>_> data_06;
  RefData<vk::Handle<(vk::HandleType)22>_> data_07;
  undefined4 uVar1;
  VkDevice pVVar2;
  VkDevice pVVar3;
  VkFormat VVar4;
  uint width;
  uint height;
  int iVar5;
  VkResult result;
  DescriptorSetLayoutBuilder *pDVar6;
  DescriptorPoolBuilder *pDVar7;
  Handle<(vk::HandleType)21> *pHVar8;
  Handle<(vk::HandleType)19> *pHVar9;
  MovePtr *this_01;
  Handle<(vk::HandleType)9> *pHVar10;
  Allocation *pAVar11;
  VkDescriptorSetLayout local_490;
  deUint64 local_488;
  deUint64 local_480;
  VkDescriptorPool local_478;
  Move<vk::Handle<(vk::HandleType)22>_> local_470;
  RefData<vk::Handle<(vk::HandleType)22>_> local_450;
  DescriptorPoolBuilder local_430;
  Move<vk::Handle<(vk::HandleType)21>_> local_418;
  RefData<vk::Handle<(vk::HandleType)21>_> local_3f8;
  DescriptorSetLayoutBuilder local_3d8;
  Move<vk::Handle<(vk::HandleType)19>_> local_390;
  RefData<vk::Handle<(vk::HandleType)19>_> local_370;
  deUint64 local_350;
  ConstPixelBufferAccess local_348;
  deUint64 local_320;
  deUint64 local_318;
  uint local_30c;
  deUint64 local_308;
  VkMemoryRequirements local_300;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_2e8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_2d8;
  Move<vk::Handle<(vk::HandleType)9>_> local_2c8;
  RefData<vk::Handle<(vk::HandleType)9>_> local_2a8;
  undefined1 local_288 [8];
  VkImageCreateInfo imageParams;
  undefined1 local_228 [4];
  int x;
  PixelBufferAccess access;
  TextureLevel texture;
  Allocator *memAlloc;
  VkImageUsageFlags imageUsageFlags;
  VkFormat format;
  TextureFormat texFormat;
  UVec2 viewportSize;
  Vec4 data [4];
  Move<vk::Handle<(vk::HandleType)22>_> local_158;
  RefData<vk::Handle<(vk::HandleType)22>_> local_138;
  DescriptorPoolBuilder local_118;
  Move<vk::Handle<(vk::HandleType)21>_> local_100;
  RefData<vk::Handle<(vk::HandleType)21>_> local_e0;
  DescriptorSetLayoutBuilder local_b0;
  Move<vk::Handle<(vk::HandleType)19>_> local_68;
  RefData<vk::Handle<(vk::HandleType)19>_> local_48;
  VkDevice local_28;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VaryingOutputCountTestInstance *this_local;
  
  local_28 = device;
  device_local = (VkDevice)vk;
  vk_local = (DeviceInterface *)this;
  this_local = (VaryingOutputCountTestInstance *)__return_storage_ptr__;
  if (this->m_test == READ_UNIFORM) {
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_b0);
    pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                       (&local_b0,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,8);
    ::vk::DescriptorSetLayoutBuilder::build
              (&local_68,pDVar6,(DeviceInterface *)device_local,local_28,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_48,(Move *)&local_68);
    data_01.deleter.m_deviceIface = local_48.deleter.m_deviceIface;
    data_01.object.m_internal = local_48.object.m_internal;
    data_01.deleter.m_device = local_48.deleter.m_device;
    data_01.deleter.m_allocator = local_48.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
              (&this->m_descriptorSetLayout,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_68);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_b0);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_118);
    pDVar7 = ::vk::DescriptorPoolBuilder::addType(&local_118,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
    ::vk::DescriptorPoolBuilder::build
              (&local_100,pDVar7,(DeviceInterface *)device_local,local_28,1,1);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
    data_02.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
    data_02.object.m_internal = local_e0.object.m_internal;
    data_02.deleter.m_device = local_e0.deleter.m_device;
    data_02.deleter.m_allocator = local_e0.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
              (&this->m_descriptorPool,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_100);
    ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_118);
    pVVar3 = device_local;
    pVVar2 = local_28;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                       (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    descriptorPool.m_internal = pHVar8->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_descriptorSetLayout).
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    makeDescriptorSet(&local_158,(DeviceInterface *)pVVar3,pVVar2,descriptorPool,
                      (VkDescriptorSetLayout)pHVar9->m_internal);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
    data_03.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
    data_03.object.m_internal = local_138.object.m_internal;
    data_03.deleter.m_device = local_138.deleter.m_device;
    data_03.deleter.m_pool.m_internal = local_138.deleter.m_pool.m_internal;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
              (&this->m_descriptorSet,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_158);
    pVVar3 = device_local;
    pVVar2 = local_28;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_descriptorSetLayout).
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    makePipelineLayout(__return_storage_ptr__,(DeviceInterface *)pVVar3,pVVar2,
                       (VkDescriptorSetLayout)pHVar9->m_internal);
  }
  else if (this->m_test == READ_TEXTURE) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&viewportSize,255.0,0.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[0].m_data + 2),0.0,255.0,0.0,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[1].m_data + 2),0.0,0.0,255.0,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(data[2].m_data + 2),0.0,0.0,0.0,255.0);
    tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&texFormat,4,1);
    _imageUsageFlags = glu::mapGLInternalFormat(0x8058);
    VVar4 = ::vk::mapTextureFormat((TextureFormat *)&imageUsageFlags);
    this_01 = (MovePtr *)
              Context::getDefaultAllocator
                        ((this->super_GeometryExpanderRenderTestInstance).super_TestInstance.
                         m_context);
    width = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&texFormat);
    height = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&texFormat);
    this_00 = &access.super_ConstPixelBufferAccess.m_data;
    tcu::TextureLevel::TextureLevel
              ((TextureLevel *)this_00,(TextureFormat *)&imageUsageFlags,width,height,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_228,(TextureLevel *)this_00);
    imageParams._84_4_ = 0;
    while( true ) {
      uVar1 = imageParams._84_4_;
      iVar5 = tcu::TextureLevel::getWidth
                        ((TextureLevel *)&access.super_ConstPixelBufferAccess.m_data);
      if (iVar5 <= (int)uVar1) break;
      tcu::PixelBufferAccess::setPixel
                ((PixelBufferAccess *)local_228,
                 (Vec4 *)(&viewportSize + (long)(int)imageParams._84_4_ * 2),imageParams._84_4_,0,0)
      ;
      imageParams._84_4_ = imageParams._84_4_ + 1;
    }
    local_288._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
    imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageParams._4_4_ = 0;
    imageParams.pNext._0_4_ = 0;
    imageParams.pNext._4_4_ = 1;
    imageParams.flags = VVar4;
    imageParams.imageType = tcu::Vector<unsigned_int,_2>::x((Vector<unsigned_int,_2> *)&texFormat);
    imageParams.format = tcu::Vector<unsigned_int,_2>::y((Vector<unsigned_int,_2> *)&texFormat);
    imageParams.extent.width = 1;
    imageParams.extent.height = 1;
    imageParams.extent.depth = 1;
    imageParams.mipLevels = 1;
    imageParams.arrayLayers = 0;
    imageParams.samples = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT;
    imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
    imageParams.usage = 0;
    imageParams.queueFamilyIndexCount = 0;
    imageParams._68_4_ = 0;
    imageParams.pQueueFamilyIndices._0_4_ = 0;
    ::vk::createImage(&local_2c8,(DeviceInterface *)device_local,local_28,
                      (VkImageCreateInfo *)local_288,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_2a8,(Move *)&local_2c8);
    data_04.deleter.m_deviceIface = local_2a8.deleter.m_deviceIface;
    data_04.object.m_internal = local_2a8.object.m_internal;
    data_04.deleter.m_device = local_2a8.deleter.m_device;
    data_04.deleter.m_allocator = local_2a8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_texture,data_04);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_2c8);
    pVVar3 = device_local;
    pVVar2 = local_28;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    local_308 = pHVar10->m_internal;
    ::vk::getImageMemoryRequirements(&local_300,(DeviceInterface *)pVVar3,pVVar2,(VkImage)local_308)
    ;
    local_30c = ::vk::MemoryRequirement::Any;
    (*(*(_func_int ***)this_01)[3])
              (&local_2e8,this_01,&local_300,(ulong)::vk::MemoryRequirement::Any);
    local_2d8 = de::details::MovePtr::operator_cast_to_PtrData(&local_2e8,this_01);
    data_00._8_8_ = local_2a8.deleter.m_deviceIface;
    data_00.ptr = (Allocation *)local_2a8.object.m_internal;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              (&this->m_allocation,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_2e8);
    pVVar3 = device_local;
    pVVar2 = local_28;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    local_318 = pHVar10->m_internal;
    pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_allocation).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    local_320 = (deUint64)::vk::Allocation::getMemory(pAVar11);
    pAVar11 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_allocation).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    ::vk::Allocation::getOffset(pAVar11);
    result = (**(code **)(*(long *)pVVar3 + 0x68))(pVVar3,pVVar2,local_318,local_320);
    ::vk::checkResult(result,
                      "vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryBasicGeometryShaderTests.cpp"
                      ,0x199);
    context = (this->super_GeometryExpanderRenderTestInstance).super_TestInstance.m_context;
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&local_348,
               (TextureLevel *)&access.super_ConstPixelBufferAccess.m_data);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                        (&(this->m_texture).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    local_350 = pHVar10->m_internal;
    uploadImage(context,&local_348,(VkImage)local_350);
    ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_3d8);
    pDVar6 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                       (&local_3d8,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,8);
    ::vk::DescriptorSetLayoutBuilder::build
              (&local_390,pDVar6,(DeviceInterface *)device_local,local_28,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_370,(Move *)&local_390);
    data_05.deleter.m_deviceIface = local_370.deleter.m_deviceIface;
    data_05.object.m_internal = local_370.object.m_internal;
    data_05.deleter.m_device = local_370.deleter.m_device;
    data_05.deleter.m_allocator = local_370.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
              (&this->m_descriptorSetLayout,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_390);
    ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_3d8);
    ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_430);
    pDVar7 = ::vk::DescriptorPoolBuilder::addType
                       (&local_430,VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,1);
    ::vk::DescriptorPoolBuilder::build
              (&local_418,pDVar7,(DeviceInterface *)device_local,local_28,1,1);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_3f8,(Move *)&local_418);
    data_06.deleter.m_deviceIface = local_3f8.deleter.m_deviceIface;
    data_06.object.m_internal = local_3f8.object.m_internal;
    data_06.deleter.m_device = local_3f8.deleter.m_device;
    data_06.deleter.m_allocator = local_3f8.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
              (&this->m_descriptorPool,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_418);
    ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_430);
    pVVar3 = device_local;
    pVVar2 = local_28;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                       (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    local_478.m_internal = pHVar8->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_descriptorSetLayout).
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    local_480 = pHVar9->m_internal;
    makeDescriptorSet(&local_470,(DeviceInterface *)pVVar3,pVVar2,local_478,
                      (VkDescriptorSetLayout)local_480);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_450,(Move *)&local_470);
    data_07.deleter.m_deviceIface = local_450.deleter.m_deviceIface;
    data_07.object.m_internal = local_450.object.m_internal;
    data_07.deleter.m_device = local_450.deleter.m_device;
    data_07.deleter.m_pool.m_internal = local_450.deleter.m_pool.m_internal;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
              (&this->m_descriptorSet,data_07);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_470);
    pVVar3 = device_local;
    pVVar2 = local_28;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                       (&(this->m_descriptorSetLayout).
                         super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    local_488 = pHVar9->m_internal;
    makePipelineLayout(__return_storage_ptr__,(DeviceInterface *)pVVar3,pVVar2,
                       (VkDescriptorSetLayout)local_488);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&access.super_ConstPixelBufferAccess.m_data);
  }
  else {
    ::vk::Handle<(vk::HandleType)19>::Handle(&local_490,0);
    makePipelineLayout(__return_storage_ptr__,vk,device,local_490);
  }
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipelineLayout> VaryingOutputCountTestInstance::createPipelineLayout (const DeviceInterface& vk, const VkDevice device)
{
	if (m_test == READ_UNIFORM)
	{
		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else if (m_test == READ_TEXTURE)
	{
		const tcu::Vec4				data[4]				=
														{
															tcu::Vec4(255, 0, 0, 0),
															tcu::Vec4(0, 255, 0, 0),
															tcu::Vec4(0, 0, 255, 0),
															tcu::Vec4(0, 0, 0, 255)
														};
		const tcu::UVec2			viewportSize		(4, 1);
		const tcu::TextureFormat	texFormat			= glu::mapGLInternalFormat(GL_RGBA8);
		const VkFormat				format				= mapTextureFormat(texFormat);
		const VkImageUsageFlags		imageUsageFlags		= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
		Allocator&					memAlloc			= m_context.getDefaultAllocator();
		tcu::TextureLevel			texture				(texFormat, static_cast<int>(viewportSize.x()), static_cast<int>(viewportSize.y()));

		// Fill with data
		{
			tcu::PixelBufferAccess access = texture.getAccess();
			for (int x = 0; x < texture.getWidth(); ++x)
				access.setPixel(data[x], x, 0);
		}
		// Create image
		const VkImageCreateInfo			imageParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,								// const void*				pNext;
			0,										// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,						// VkImageType				imageType;
			format,									// VkFormat					format;
			{										// VkExtent3D				extent;
					viewportSize.x(),
					viewportSize.y(),
					1u,
			},
			1u,							// deUint32					mipLevels;
			1u,							// deUint32					arrayLayers;
			VK_SAMPLE_COUNT_1_BIT,		// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,	// VkImageTiling			tiling;
			imageUsageFlags,			// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,	// VkSharingMode			sharingMode;
			0u,							// deUint32					queueFamilyIndexCount;
			DE_NULL,					// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED	// VkImageLayout			initialLayout;
		};

		m_texture		= createImage(vk, device, &imageParams);
		m_allocation	= memAlloc.allocate(getImageMemoryRequirements(vk, device, *m_texture), MemoryRequirement::Any);
		VK_CHECK(vk.bindImageMemory(device, *m_texture, m_allocation->getMemory(), m_allocation->getOffset()));
		uploadImage(m_context, texture.getAccess(), *m_texture);

		m_descriptorSetLayout	=	DescriptorSetLayoutBuilder()
									.addSingleBinding(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, VK_SHADER_STAGE_GEOMETRY_BIT)
									.build(vk, device);
		m_descriptorPool		=	DescriptorPoolBuilder()
									.addType(VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER)
									.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);
		m_descriptorSet			=	makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

		return makePipelineLayout(vk, device, *m_descriptorSetLayout);
	}
	else
		return makePipelineLayout(vk, device);
}